

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O0

int __thiscall
packed_gamma_file3<unsigned_int,_6UL>::close(packed_gamma_file3<unsigned_int,_6UL> *this,int __fd)

{
  int iVar1;
  size_type sVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  reference pvVar4;
  uchar *puVar5;
  uint64_t i;
  uint8_t max_bitsize;
  packed_gamma_file3<unsigned_int,_6UL> *in_stack_000000d0;
  value_type *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint8_t local_19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  uchar local_9;
  packed_gamma_file3<unsigned_int,_6UL> *local_8;
  
  local_8 = this;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->buffer);
  if (sVar2 % 6 != 0) {
    local_9 = '\0';
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->buffer);
    local_18 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((sVar2 / 6) * 6);
    while( true ) {
      this_00 = local_18;
      pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->buffer);
      if (pvVar3 <= this_00) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->buffer,(size_type)local_18);
      local_19 = wd(this,(ulong)*pvVar4);
      puVar5 = std::max<unsigned_char>(&local_9,&local_19);
      local_9 = *puVar5;
      local_18 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(local_18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,in_stack_ffffffffffffffc8);
  }
  flush_to_file(in_stack_000000d0);
  iVar1 = std::ofstream::close();
  return iVar1;
}

Assistant:

void close(){

		assert(write);

		//in this case we did not compute last bitsize
		if(buffer.size()%block_size != 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=(buffer.size()/block_size)*block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		flush_to_file();

		out.close();

	}